

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_creation.cpp
# Opt level: O2

void construction_algorithm_parameters(void)

{
  max_leaf_size_t max_leaf_size;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  tree;
  splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> local_111;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  local_e8;
  _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_70;
  _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_58;
  _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_40;
  _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_28;
  
  local_108 = 1;
  make_point_set();
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_e8,(space_type *)&local_28,
             (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)&local_108,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)&local_110,&local_111);
  std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~_Vector_base
            (&local_28);
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (&local_e8);
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(&local_e8);
  local_108 = 0;
  make_point_set();
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_depth_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_e8,(space_type *)&local_40,
             (splitter_stop_condition_t<pico_tree::max_leaf_depth_t> *)&local_108,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)&local_110,&local_111);
  std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~_Vector_base
            (&local_40);
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (&local_e8);
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(&local_e8);
  make_point_set();
  local_110 = 1;
  local_108 = 0;
  uStack_100 = 0x4110000000000000;
  local_f8 = 0x4110000041100000;
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_t<std::array<float,3ul>>,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_e8,(space_type *)&local_58,
             (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)&local_110,
             (splitter_start_bounds_t<pico_tree::bounds_t<std::array<float,_3UL>_>_> *)&local_108,
             &local_111);
  std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~_Vector_base
            (&local_58);
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (&local_e8);
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(&local_e8);
  make_point_set();
  local_108 = 1;
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::median_max_side_t>
            ((kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_e8,(space_type *)&local_70,
             (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)&local_108,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)
             &pico_tree::bounds_from_space,
             (splitter_rule_t<pico_tree::median_max_side_t> *)&pico_tree::median_max_side);
  std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~_Vector_base
            (&local_70);
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (&local_e8);
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(&local_e8);
  return;
}

Assistant:

void construction_algorithm_parameters() {
  {
    // Every point is a leaf in the resulting kd_tree.
    pico_tree::max_leaf_size_t max_leaf_size = 1;
    pico_tree::kd_tree tree(make_point_set(), max_leaf_size);
    query_tree(tree);
  }

  {
    // The resulting kd_tree has a depth of 0. I.e., the tree is a single leaf.
    pico_tree::max_leaf_depth_t max_leaf_depth = 0;
    pico_tree::kd_tree tree(make_point_set(), max_leaf_depth);
    query_tree(tree);
  }

  {
    // Setting a custom input bounds for the point cloud. The default argument
    // equals pico_tree::bounds_from_space. This determines the bounding box
    // from the input dataset. Setting a custom bounding box can make building
    // the tree a bit more efficient if the bounds for the input point set is
    // already known.
    pico_tree::kd_tree tree(
        make_point_set(),
        pico_tree::max_leaf_size_t(1),
        pico_tree::bounds_t(
            std::array{0.0f, 0.0f, 0.0f}, std::array{9.0f, 9.0f, 9.0f}));
    query_tree(tree);
  }

  {
    // Setting the split rule as the 4th argument. It can be one of:
    // * pico_tree::median_max_side
    // * pico_tree::midpoint_max_side
    // * pico_tree::sliding_midpoint_max_side
    // The default argument is pico_tree::sliding_midpoint_max_side.
    pico_tree::kd_tree tree(
        make_point_set(),
        pico_tree::max_leaf_size_t(1),
        pico_tree::bounds_from_space,
        pico_tree::median_max_side);
    query_tree(tree);
  }
}